

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void Service_DeleteReferences
               (UA_Server *server,UA_Session *session,UA_DeleteReferencesRequest *request,
               UA_DeleteReferencesResponse *response)

{
  size_t sVar1;
  UA_StatusCode UVar2;
  UA_StatusCode *pUVar3;
  UA_DeleteReferencesItem *extraout_RDX;
  UA_DeleteReferencesItem *item;
  UA_DeleteReferencesItem *extraout_RDX_00;
  long lVar4;
  size_t i;
  ulong uVar5;
  
  sVar1 = request->referencesToDeleteSize;
  if (sVar1 == 0) {
    UVar2 = 0x800f0000;
  }
  else {
    pUVar3 = (UA_StatusCode *)malloc(sVar1 * 4);
    response->results = pUVar3;
    if (pUVar3 != (UA_StatusCode *)0x0) {
      response->resultsSize = sVar1;
      lVar4 = 0;
      uVar5 = 0;
      item = extraout_RDX;
      do {
        UVar2 = deleteReference(server,(UA_Session *)
                                       ((long)&(request->referencesToDelete->sourceNodeId).
                                               namespaceIndex + lVar4),item);
        response->results[uVar5] = UVar2;
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x70;
        item = extraout_RDX_00;
      } while (uVar5 < request->referencesToDeleteSize);
      return;
    }
    UVar2 = 0x80030000;
  }
  (response->responseHeader).serviceResult = UVar2;
  return;
}

Assistant:

void
Service_DeleteReferences(UA_Server *server, UA_Session *session,
                         const UA_DeleteReferencesRequest *request,
                         UA_DeleteReferencesResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Processing DeleteReferencesRequest");
    if(request->referencesToDeleteSize <= 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    response->results = UA_malloc(sizeof(UA_StatusCode) * request->referencesToDeleteSize);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;;
        return;
    }
    response->resultsSize = request->referencesToDeleteSize;

    for(size_t i = 0; i < request->referencesToDeleteSize; ++i)
        response->results[i] =
            deleteReference(server, session, &request->referencesToDelete[i]);
}